

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void last_valueStepFunc(sqlite3_context *pCtx,int nArg,sqlite3_value **apArg)

{
  undefined8 *puVar1;
  sqlite3_value *psVar2;
  
  puVar1 = (undefined8 *)sqlite3_aggregate_context(pCtx,0x10);
  if (puVar1 != (undefined8 *)0x0) {
    sqlite3ValueFree((sqlite3_value *)*puVar1);
    psVar2 = sqlite3_value_dup(*apArg);
    *puVar1 = psVar2;
    if (psVar2 == (sqlite3_value *)0x0) {
      sqlite3_result_error_nomem(pCtx);
      return;
    }
    *(int *)(puVar1 + 1) = *(int *)(puVar1 + 1) + 1;
  }
  return;
}

Assistant:

static void last_valueStepFunc(
  sqlite3_context *pCtx, 
  int nArg,
  sqlite3_value **apArg
){
  struct LastValueCtx *p;
  UNUSED_PARAMETER(nArg);
  p = (struct LastValueCtx*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  if( p ){
    sqlite3_value_free(p->pVal);
    p->pVal = sqlite3_value_dup(apArg[0]);
    if( p->pVal==0 ){
      sqlite3_result_error_nomem(pCtx);
    }else{
      p->nVal++;
    }
  }
}